

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  cmState *this;
  size_t sVar1;
  char *__s;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_b1);
  if (briefDocs == (char *)0x0) {
    briefDocs = "";
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  sVar1 = strlen(briefDocs);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,briefDocs,briefDocs + sVar1);
  __s = "";
  if (longDocs != (char *)0x0) {
    __s = longDocs;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar1);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  cmState::DefineProperty(this,&local_50,SOURCE_FILE,&local_90,&local_b0,chained != 0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                           const char* briefDocs,
                                           const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE,
                                 briefDocs ? briefDocs : "",
                                 longDocs ? longDocs : "", chained != 0);
}